

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-player.c
# Opt level: O1

wchar_t project_player_handler_GRAVITY(project_player_handler_context_t *context)

{
  player *p;
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  source origin;
  
  msg("Gravity warps around you.");
  uVar2 = Rand_div(0x7f);
  if ((int)player->lev <= (int)uVar2) {
    origin._4_4_ = 0;
    origin.what = (context->origin).what;
    origin.which.trap = (context->origin).which.trap;
    effect_simple(L';',origin,"5",L'\x01',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
  }
  p = player;
  uVar2 = Rand_div(4);
  player_inc_timed(p,L'\x01',uVar2 + L'\x04',true,true,false);
  _Var1 = player_of_has(player,L'\t');
  if (_Var1) {
    equip_learn_flag(player,L'\t');
  }
  else {
    uVar3 = Rand_div(context->dam / 3);
    uVar2 = 0x1d;
    if ((int)uVar3 < 0x1d) {
      uVar2 = uVar3;
    }
    player_inc_timed(player,L'\t',uVar2 + L'\x06',true,true,true);
  }
  return L'\0';
}

Assistant:

static int project_player_handler_GRAVITY(project_player_handler_context_t *context)
{
	msg("Gravity warps around you.");

	/* Blink */
	if (randint1(127) > player->lev) {
		const char *five = "5";
		effect_simple(EF_TELEPORT, context->origin, five, 1, 0, 0, 0, 0, NULL);
	}

	/* Slow */
	(void)player_inc_timed(player, TMD_SLOW, 4 + randint0(4), true, true,
		false);

	/* Stun */
	if (!player_of_has(player, OF_PROT_STUN)) {
		int duration = 5 + randint1(context->dam / 3);
		if (duration > 35) duration = 35;
		(void)player_inc_timed(player, TMD_STUN, duration, true, true,
			true);
	} else {
		equip_learn_flag(player, OF_PROT_STUN);
	}
	return 0;
}